

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

bool DnsStats::IsInSortedList(char **list,size_t nb_list,uint8_t *tld,size_t length)

{
  uint8_t uVar1;
  int iVar2;
  size_t i;
  size_t sVar3;
  uint8_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  uint8_t target [64];
  uint8_t local_78 [72];
  
  if (length < 0x40) {
    for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
      uVar1 = tld[sVar3];
      uVar4 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar4 = uVar1;
      }
      local_78[sVar3] = uVar4;
    }
    iVar2 = CompareToUpperCaseString(local_78,length,*list);
    if (iVar2 == 0) {
      return true;
    }
    if (-1 < iVar2) {
      iVar2 = CompareToUpperCaseString(local_78,length,list[nb_list - 1]);
      if (iVar2 == 0) {
        return true;
      }
      if (iVar2 < 1) {
        uVar6 = 0;
        uVar5 = nb_list - 1;
        while( true ) {
          uVar7 = uVar5;
          bVar8 = uVar6 + 1 < uVar7;
          if (!bVar8) {
            return bVar8;
          }
          uVar5 = uVar7 + uVar6 >> 1;
          iVar2 = CompareToUpperCaseString(local_78,length,list[uVar5]);
          if (iVar2 == 0) break;
          if (-1 < iVar2) {
            uVar6 = uVar5;
            uVar5 = uVar7;
          }
        }
        return bVar8;
      }
    }
  }
  return false;
}

Assistant:

bool DnsStats::IsInSortedList(const char ** list, size_t nb_list, uint8_t * tld, size_t length)
{
    bool is_found = false;
    size_t i_low = 0;
    size_t i_high = nb_list - 1;
    int c;
    uint8_t target[64];

    if (length < sizeof(target)) {
        for (size_t i = 0; i < length; i++) {
            c = tld[i];
            if (c >= 'a' && c <= 'z') {
                c += 'A' - 'a';
            }
            target[i] = c;
        }

        c = CompareToUpperCaseString(target, length, list[i_low]);
        if (c == 0) {
            is_found = true;
        }
        else if (c < 0) {
            is_found = false;
        }
        else {
            c = CompareToUpperCaseString(target, length, list[i_high]);
            if (c == 0) {
                is_found = true;
            }
            else if (c > 0) {
                is_found = false;
            }
            else {
                while (i_low + 1 < i_high) {
                    size_t i_mid = (i_low + i_high) / 2;
                    c = CompareToUpperCaseString(target, length, list[i_mid]);
                    if (c == 0) {
                        is_found = true;
                        break;
                    }
                    else if (c < 0) {
                        i_high = i_mid;
                    }
                    else {
                        i_low = i_mid;
                    }
                }
            }
        }
    }
    return is_found;
}